

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_update(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ion_bpp_err_t iVar1;
  int iVar2;
  ion_bpp_buffer_t *local_90;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_h_node_t *h;
  int height;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_buffer_t *root;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *piStack_38;
  int cc;
  ion_bpp_key_t *mkey;
  ion_bpp_external_address_t iStack_28;
  int rc;
  ion_bpp_external_address_t rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  root = (ion_bpp_buffer_t *)((long)handle + 0x20);
  cbuf = (ion_bpp_buffer_t *)handle;
  iStack_28 = rec;
  rec_local = (ion_bpp_external_address_t)key;
  key_local = handle;
  if ((uint)(**(ushort **)((long)handle + 0x38) >> 1) == *(int *)((long)handle + 0xb8) * 3) {
    mkey._4_4_ = gatherRoot(handle);
    if (mkey._4_4_ != bErrOk) {
      return mkey._4_4_;
    }
    iVar1 = scatter(key_local,root,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,
                    (ion_bpp_buffer_t **)&stack0xffffffffffffff88);
    if (iVar1 != bErrOk) {
      return iVar1;
    }
    mkey._4_4_ = 0;
  }
  h._4_4_ = 0;
  do {
    if ((undefined1  [40])((undefined1  [40])*root->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      if (maxHeight < h._4_4_) {
        maxHeight = h._4_4_;
      }
      iVar2 = search(key_local,root,(void *)rec_local,iStack_28,&stack0xffffffffffffffc8,MODE_MATCH)
      ;
      if (iVar2 == -1) {
        handle_local._4_4_ = bErrKeyNotFound;
      }
      else if ((iVar2 == 0) || (iVar2 != 1)) {
        *(ion_bpp_external_address_t *)(piStack_38 + *(int *)&cbuf->prev) = iStack_28;
        handle_local._4_4_ = bErrOk;
      }
      else {
        handle_local._4_4_ = bErrKeyNotFound;
      }
      return handle_local._4_4_;
    }
    h._4_4_ = h._4_4_ + 1;
    iVar2 = search(key_local,root,(void *)rec_local,iStack_28,&stack0xffffffffffffffc8,MODE_MATCH);
    if (iVar2 < 0) {
      iVar1 = readDisk(key_local,*(ion_bpp_address_t *)(piStack_38 + -8),&local_90);
    }
    else {
      iVar1 = readDisk(key_local,*(ion_bpp_address_t *)(piStack_38 + (long)*(int *)&cbuf->prev + 8),
                       &local_90);
    }
    if (iVar1 != bErrOk) {
      return iVar1;
    }
    mkey._4_4_ = 0;
    if ((uint)(*(ushort *)local_90->p >> 1) == *(uint *)&cbuf[4].p) {
      mkey._4_4_ = gather(key_local,root,&stack0xffffffffffffffc8,
                          (ion_bpp_buffer_t **)&stack0xffffffffffffff88);
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      mkey._4_4_ = scatter(key_local,root,piStack_38,3,(ion_bpp_buffer_t **)&stack0xffffffffffffff88
                          );
      if (mkey._4_4_ != bErrOk) {
        return mkey._4_4_;
      }
      iVar2 = search(key_local,root,(void *)rec_local,iStack_28,&stack0xffffffffffffffc8,MODE_MATCH)
      ;
      if (iVar2 < 0) {
        iVar1 = readDisk(key_local,*(ion_bpp_address_t *)(piStack_38 + -8),&local_90);
      }
      else {
        iVar1 = readDisk(key_local,
                         *(ion_bpp_address_t *)(piStack_38 + (long)*(int *)&cbuf->prev + 8),
                         &local_90);
      }
      if (iVar1 != bErrOk) {
        return iVar1;
      }
    }
    mkey._4_4_ = 0;
    root = local_90;
  } while( true );
}

Assistant:

ion_bpp_err_t
b_update(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;	/* match key */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root = &h->root;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to update point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */
					return bErrKeyNotFound;
					break;

				case ION_CC_EQ:	/* key = mkey */
					break;

				case ION_CC_GT:	/* key > mkey */
					return bErrKeyNotFound;
					break;
			}

			/* update key */
			rec(mkey) = rec;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}